

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O0

string_view __thiscall absl::cord_internal::CordRepBtreeReader::Next(CordRepBtreeReader *this)

{
  CordRep *edge_00;
  CordRep *edge;
  CordRepBtreeReader *this_local;
  
  if (this->remaining_ == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  }
  else {
    edge_00 = CordRepBtreeNavigator::Next(&this->navigator_);
    if (edge_00 == (CordRep *)0x0) {
      __assert_fail("edge != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree_reader.h"
                    ,0xb1,"absl::string_view absl::cord_internal::CordRepBtreeReader::Next()");
    }
    this->remaining_ = this->remaining_ - edge_00->length;
    _this_local = EdgeData(edge_00);
  }
  return _this_local;
}

Assistant:

inline absl::string_view CordRepBtreeReader::Next() {
  if (remaining_ == 0) return {};
  const CordRep* edge = navigator_.Next();
  assert(edge != nullptr);
  remaining_ -= edge->length;
  return EdgeData(edge);
}